

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_MAX_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  
  TVar1 = TA_MAX(in_ESI,in_EDX,(double *)**(undefined8 **)(in_RDI + 8),**(int **)(in_RDI + 0x10),
                 in_RCX,in_R8,(double *)**(undefined8 **)(in_RDI + 0x18));
  return TVar1;
}

Assistant:

TA_RetCode TA_MAX_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MAX(
/* Generated */             startIdx,
/* Generated */             endIdx,
/* Generated */             params->in[0].data.inReal, /* inReal */
/* Generated */             params->optIn[0].data.optInInteger, /* optInTimePeriod*/
/* Generated */             outBegIdx, 
/* Generated */             outNBElement, 
/* Generated */             params->out[0].data.outReal /*  outReal */ );
/* Generated */ }